

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O3

int run_test_getters_setters(void)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_fs_type uVar3;
  int extraout_EAX;
  size_t sVar4;
  uv_loop_t *puVar5;
  int *piVar6;
  uv_loop_t *puVar7;
  uv_fs_t *req;
  ssize_t sVar8;
  uv_stat_t *puVar9;
  uv_stat_t *puVar10;
  char *pcVar11;
  uv_loop_t *unaff_RBX;
  uv_pipe_t *unaff_R14;
  uv_os_fd_t uStack_4ec;
  sockaddr_in sStack_4e8;
  undefined1 auStack_4d8 [120];
  undefined1 auStack_460 [216];
  undefined1 auStack_388 [312];
  undefined1 auStack_250 [248];
  undefined1 auStack_158 [272];
  uv_pipe_t *puStack_48;
  uv_timeval64_t uStack_38;
  
  uStack_38._8_8_ = 0x159d8d;
  sVar4 = uv_loop_size();
  uStack_38._8_8_ = 0x159d95;
  puVar5 = (uv_loop_t *)malloc(sVar4);
  if (puVar5 == (uv_loop_t *)0x0) {
LAB_00159f89:
    puVar5 = unaff_RBX;
    uStack_38._8_8_ = 0x159f8e;
    run_test_getters_setters_cold_19();
LAB_00159f8e:
    uStack_38._8_8_ = 0x159f93;
    run_test_getters_setters_cold_1();
LAB_00159f93:
    uStack_38._8_8_ = 0x159f98;
    run_test_getters_setters_cold_2();
LAB_00159f98:
    uStack_38._8_8_ = 0x159f9d;
    run_test_getters_setters_cold_3();
LAB_00159f9d:
    uStack_38._8_8_ = 0x159fa2;
    run_test_getters_setters_cold_4();
LAB_00159fa2:
    uStack_38._8_8_ = 0x159fa7;
    run_test_getters_setters_cold_5();
LAB_00159fa7:
    uStack_38._8_8_ = 0x159fac;
    run_test_getters_setters_cold_6();
LAB_00159fac:
    uStack_38._8_8_ = 0x159fb1;
    run_test_getters_setters_cold_7();
LAB_00159fb1:
    uStack_38._8_8_ = 0x159fb6;
    run_test_getters_setters_cold_8();
LAB_00159fb6:
    uStack_38._8_8_ = 0x159fbb;
    run_test_getters_setters_cold_9();
LAB_00159fbb:
    uStack_38._8_8_ = 0x159fc0;
    run_test_getters_setters_cold_10();
LAB_00159fc0:
    uStack_38._8_8_ = 0x159fc5;
    run_test_getters_setters_cold_11();
LAB_00159fc5:
    uStack_38._8_8_ = 0x159fca;
    run_test_getters_setters_cold_12();
LAB_00159fca:
    uStack_38._8_8_ = 0x159fcf;
    run_test_getters_setters_cold_13();
LAB_00159fcf:
    uStack_38._8_8_ = 0x159fd4;
    run_test_getters_setters_cold_14();
LAB_00159fd4:
    uStack_38._8_8_ = 0x159fd9;
    run_test_getters_setters_cold_15();
LAB_00159fd9:
    uStack_38._8_8_ = 0x159fde;
    run_test_getters_setters_cold_18();
  }
  else {
    uStack_38._8_8_ = 0x159da9;
    iVar1 = uv_loop_init(puVar5);
    if (iVar1 != 0) goto LAB_00159f8e;
    uStack_38._8_8_ = 0x159dc3;
    uv_loop_set_data(puVar5,&cookie1);
    if ((int *)puVar5->data != &cookie1) goto LAB_00159f93;
    uStack_38._8_8_ = 0x159dd4;
    piVar6 = (int *)uv_loop_get_data(puVar5);
    if (piVar6 != &cookie1) goto LAB_00159f98;
    uStack_38._8_8_ = 0x159de7;
    sVar4 = uv_handle_size(UV_NAMED_PIPE);
    uStack_38._8_8_ = 0x159def;
    unaff_R14 = (uv_pipe_t *)malloc(sVar4);
    uStack_38._8_8_ = 0x159dff;
    uv_pipe_init(puVar5,unaff_R14,0);
    uStack_38._8_8_ = 0x159e07;
    uVar2 = uv_handle_get_type((uv_handle_t *)unaff_R14);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_00159f9d;
    uStack_38._8_8_ = 0x159e18;
    puVar7 = uv_handle_get_loop((uv_handle_t *)unaff_R14);
    if (puVar7 != puVar5) goto LAB_00159fa2;
    unaff_R14->data = &cookie2;
    uStack_38._8_8_ = 0x159e33;
    piVar6 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar6 != &cookie2) goto LAB_00159fa7;
    uStack_38._8_8_ = 0x159e47;
    uv_handle_set_data((uv_handle_t *)unaff_R14,&cookie1);
    uStack_38._8_8_ = 0x159e4f;
    piVar6 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar6 != &cookie1) goto LAB_00159fac;
    if ((int *)unaff_R14->data != &cookie1) goto LAB_00159fb1;
    uStack_38._8_8_ = 0x159e69;
    sVar4 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar4 != 0) goto LAB_00159fb6;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size + 1;
    uStack_38._8_8_ = 0x159e7e;
    sVar4 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar4 != 1) goto LAB_00159fbb;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size - 1;
    uStack_38._8_8_ = 0x159e96;
    uv_close((uv_handle_t *)unaff_R14,(uv_close_cb)0x0);
    uStack_38._8_8_ = 0x159ea0;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00159fc0;
    uStack_38._8_8_ = 0x159eb2;
    sVar4 = uv_req_size(UV_FS);
    uStack_38._8_8_ = 0x159eba;
    req = (uv_fs_t *)malloc(sVar4);
    uStack_38._8_8_ = 0x159ed1;
    uv_fs_stat(puVar5,req,".",(uv_fs_cb)0x0);
    uStack_38._8_8_ = 0x159edb;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00159fc5;
    uStack_38._8_8_ = 0x159eeb;
    uVar3 = uv_fs_get_type(req);
    if (uVar3 != UV_FS_STAT) goto LAB_00159fca;
    uStack_38._8_8_ = 0x159efc;
    sVar8 = uv_fs_get_result(req);
    if (sVar8 != 0) goto LAB_00159fcf;
    uStack_38._8_8_ = 0x159f0d;
    puVar9 = (uv_stat_t *)uv_fs_get_ptr(req);
    uStack_38._8_8_ = 0x159f18;
    puVar10 = uv_fs_get_statbuf(req);
    if (puVar9 != puVar10) goto LAB_00159fd4;
    uStack_38._8_8_ = 0x159f29;
    puVar9 = uv_fs_get_statbuf(req);
    if ((puVar9->st_mode & 0x4000) == 0) goto LAB_00159fd9;
    uStack_38._8_8_ = 0x159f3b;
    pcVar11 = uv_fs_get_path(req);
    if ((*pcVar11 != '.') || (pcVar11[1] != '\0')) {
      uStack_38._8_8_ = 0x159f89;
      run_test_getters_setters_cold_16();
      unaff_RBX = puVar5;
      goto LAB_00159f89;
    }
    uStack_38._8_8_ = 0x159f4e;
    uv_fs_req_cleanup(req);
    uStack_38._8_8_ = 0x159f56;
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      uStack_38._8_8_ = 0x159f66;
      free(unaff_R14);
      uStack_38._8_8_ = 0x159f6e;
      free(req);
      uStack_38._8_8_ = 0x159f76;
      free(puVar5);
      return 0;
    }
  }
  uStack_38._8_8_ = 0x159fe3;
  run_test_getters_setters_cold_17();
  uStack_38.tv_sec = 0;
  puStack_48 = (uv_pipe_t *)0x159ff9;
  iVar1 = uv_gettimeofday(&uStack_38);
  if (iVar1 == 0) {
    if ((void *)uStack_38.tv_sec == (void *)0x0) goto LAB_0015a01d;
    puStack_48 = (uv_pipe_t *)0x15a00c;
    iVar1 = uv_gettimeofday((uv_timeval64_t *)0x0);
    if (iVar1 == -0x16) {
      return 0;
    }
  }
  else {
    puStack_48 = (uv_pipe_t *)0x15a01d;
    run_test_gettimeofday_cold_1();
LAB_0015a01d:
    puStack_48 = (uv_pipe_t *)0x15a022;
    run_test_gettimeofday_cold_3();
  }
  puStack_48 = (uv_pipe_t *)0x15a027;
  run_test_gettimeofday_cold_2();
  auStack_158._264_8_ = puVar5;
  puStack_48 = unaff_R14;
  puVar7 = uv_default_loop();
  puVar5 = (uv_loop_t *)0x1a4b3a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_4e8);
  if (iVar1 == 0) {
    puVar5 = puVar7;
    iVar1 = uv_idle_init(puVar7,(uv_idle_t *)auStack_4d8);
    if (iVar1 != 0) goto LAB_0015a369;
    puVar5 = (uv_loop_t *)auStack_4d8;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -0x16) goto LAB_0015a36e;
    uv_close((uv_handle_t *)auStack_4d8,(uv_close_cb)0x0);
    puVar5 = puVar7;
    iVar1 = uv_tcp_init(puVar7,(uv_tcp_t *)auStack_250);
    if (iVar1 != 0) goto LAB_0015a373;
    puVar5 = (uv_loop_t *)auStack_250;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a378;
    puVar5 = (uv_loop_t *)auStack_250;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar5,(sockaddr *)&sStack_4e8,0);
    if (iVar1 != 0) goto LAB_0015a37d;
    puVar5 = (uv_loop_t *)auStack_250;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a382;
    puVar5 = (uv_loop_t *)auStack_250;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a387;
    puVar5 = puVar7;
    iVar1 = uv_udp_init(puVar7,(uv_udp_t *)auStack_460);
    if (iVar1 != 0) goto LAB_0015a38c;
    puVar5 = (uv_loop_t *)auStack_460;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a391;
    puVar5 = (uv_loop_t *)auStack_460;
    iVar1 = uv_udp_bind((uv_udp_t *)puVar5,(sockaddr *)&sStack_4e8,0);
    if (iVar1 != 0) goto LAB_0015a396;
    puVar5 = (uv_loop_t *)auStack_460;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a39b;
    puVar5 = (uv_loop_t *)auStack_460;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a3a0;
    puVar5 = puVar7;
    iVar1 = uv_pipe_init(puVar7,(uv_pipe_t *)auStack_158,0);
    if (iVar1 != 0) goto LAB_0015a3a5;
    puVar5 = (uv_loop_t *)auStack_158;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a3aa;
    puVar5 = (uv_loop_t *)auStack_158;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar5,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015a3af;
    puVar5 = (uv_loop_t *)auStack_158;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a3b4;
    puVar5 = (uv_loop_t *)auStack_158;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a3b9;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015a312:
      uv_run(puVar7,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015a3be;
    }
    puVar5 = puVar7;
    iVar1 = uv_tty_init(puVar7,(uv_tty_t *)auStack_388,iVar1,0);
    if (iVar1 != 0) goto LAB_0015a3c3;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_is_readable((uv_stream_t *)puVar5);
    if (iVar1 == 0) goto LAB_0015a3c8;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_is_writable((uv_stream_t *)puVar5);
    if (iVar1 != 0) goto LAB_0015a3cd;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a3d2;
    puVar5 = (uv_loop_t *)auStack_388;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a3d7;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_is_readable((uv_stream_t *)puVar5);
    if (iVar1 == 0) {
      puVar5 = (uv_loop_t *)auStack_388;
      iVar1 = uv_is_writable((uv_stream_t *)puVar5);
      if (iVar1 != 0) goto LAB_0015a3e1;
      goto LAB_0015a312;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015a369:
    run_test_handle_fileno_cold_2();
LAB_0015a36e:
    run_test_handle_fileno_cold_3();
LAB_0015a373:
    run_test_handle_fileno_cold_4();
LAB_0015a378:
    run_test_handle_fileno_cold_5();
LAB_0015a37d:
    run_test_handle_fileno_cold_6();
LAB_0015a382:
    run_test_handle_fileno_cold_7();
LAB_0015a387:
    run_test_handle_fileno_cold_8();
LAB_0015a38c:
    run_test_handle_fileno_cold_9();
LAB_0015a391:
    run_test_handle_fileno_cold_10();
LAB_0015a396:
    run_test_handle_fileno_cold_11();
LAB_0015a39b:
    run_test_handle_fileno_cold_12();
LAB_0015a3a0:
    run_test_handle_fileno_cold_13();
LAB_0015a3a5:
    run_test_handle_fileno_cold_14();
LAB_0015a3aa:
    run_test_handle_fileno_cold_15();
LAB_0015a3af:
    run_test_handle_fileno_cold_16();
LAB_0015a3b4:
    run_test_handle_fileno_cold_17();
LAB_0015a3b9:
    run_test_handle_fileno_cold_18();
LAB_0015a3be:
    run_test_handle_fileno_cold_27();
LAB_0015a3c3:
    run_test_handle_fileno_cold_19();
LAB_0015a3c8:
    run_test_handle_fileno_cold_25();
LAB_0015a3cd:
    run_test_handle_fileno_cold_20();
LAB_0015a3d2:
    run_test_handle_fileno_cold_21();
LAB_0015a3d7:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015a3e1:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)puVar5);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(getters_setters) {
  uv_loop_t* loop;
  uv_pipe_t* pipe;
  uv_fs_t* fs;
  int r;

  loop = malloc(uv_loop_size());
  ASSERT(loop != NULL);
  r = uv_loop_init(loop);
  ASSERT(r == 0);

  uv_loop_set_data(loop, &cookie1);
  ASSERT(loop->data == &cookie1);
  ASSERT(uv_loop_get_data(loop) == &cookie1);

  pipe = malloc(uv_handle_size(UV_NAMED_PIPE));
  r = uv_pipe_init(loop, pipe, 0);
  ASSERT(uv_handle_get_type((uv_handle_t*)pipe) == UV_NAMED_PIPE);

  ASSERT(uv_handle_get_loop((uv_handle_t*)pipe) == loop);
  pipe->data = &cookie2;
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie2);
  uv_handle_set_data((uv_handle_t*)pipe, &cookie1);
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie1);
  ASSERT(pipe->data == &cookie1);

  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 0);
  pipe->write_queue_size++;
  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 1);
  pipe->write_queue_size--;
  uv_close((uv_handle_t*)pipe, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  fs = malloc(uv_req_size(UV_FS));
  uv_fs_stat(loop, fs, ".", NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(uv_fs_get_type(fs) == UV_FS_STAT);
  ASSERT(uv_fs_get_result(fs) == 0);
  ASSERT(uv_fs_get_ptr(fs) == uv_fs_get_statbuf(fs));
  ASSERT(uv_fs_get_statbuf(fs)->st_mode & S_IFDIR);
  ASSERT(strcmp(uv_fs_get_path(fs), ".") == 0);
  uv_fs_req_cleanup(fs);

  r = uv_loop_close(loop);
  ASSERT(r == 0);

  free(pipe);
  free(fs);
  free(loop);
  return 0;
}